

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialEnergyObjectiveFunction.cpp
# Opt level: O1

RealType __thiscall
OpenMD::PotentialEnergyObjectiveFunction::valueAndGradient
          (PotentialEnergyObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *grad,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  RealType RVar1;
  
  setCoor(this,x);
  Shake::constraintR(this->shake_);
  (*this->forceMan_->_vptr_ForceManager[2])();
  if (this->hasFlucQ_ == true) {
    FluctuatingChargeConstraints::applyConstraints(this->fqConstraints_);
  }
  Shake::constraintF(this->shake_);
  getGrad(this,grad);
  RVar1 = Thermo::getPotential(&this->thermo);
  return RVar1;
}

Assistant:

RealType PotentialEnergyObjectiveFunction::valueAndGradient(
      DynamicVector<RealType>& grad, const DynamicVector<RealType>& x) {
    setCoor(x);
    shake_->constraintR();
    forceMan_->calcForces();
    if (hasFlucQ_) fqConstraints_->applyConstraints();
    shake_->constraintF();
    getGrad(grad);
    return thermo.getPotential();
  }